

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O3

string * utf8_to_local(string *__return_storage_ptr__,string *utf8)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string utf8_to_local(const std::string& utf8)
{
    std::string out;
    utf8_to_local(utf8, &out);
    return out;
}